

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::formatReconstructedExpression(ostream *os,string *lhs,StringRef op,string *rhs)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  ostream *poVar4;
  string *in_RSI;
  ostream *in_RDI;
  StringRef *in_R8;
  
  lVar1 = std::__cxx11::string::size();
  lVar2 = std::__cxx11::string::size();
  if ((((ulong)(lVar1 + lVar2) < 0x28) &&
      (lVar1 = std::__cxx11::string::find((char)in_RSI,10), lVar1 == -1)) &&
     (lVar1 = std::__cxx11::string::find((char)in_R8,10), lVar1 == -1)) {
    poVar3 = std::operator<<(in_RDI,in_RSI);
    std::operator<<(poVar3," ");
    poVar4 = operator<<((ostream *)in_RSI,in_R8);
    poVar3 = std::operator<<((ostream *)poVar4," ");
    std::operator<<(poVar3,(string *)in_R8);
    return;
  }
  poVar3 = std::operator<<(in_RDI,in_RSI);
  std::operator<<(poVar3,"\n");
  poVar4 = operator<<((ostream *)in_RSI,in_R8);
  poVar3 = std::operator<<((ostream *)poVar4,"\n");
  std::operator<<(poVar3,(string *)in_R8);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }